

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileUtil.cc
# Opt level: O0

int __thiscall muduo::FileUtil::ReadSmallFile::readToBuffer(ReadSmallFile *this,int *size)

{
  ssize_t sVar1;
  int *piVar2;
  undefined4 *in_RSI;
  int *in_RDI;
  ssize_t n;
  int err;
  int local_14;
  
  local_14 = in_RDI[1];
  if (-1 < *in_RDI) {
    sVar1 = pread(*in_RDI,in_RDI + 2,0xffff,0);
    if (sVar1 < 0) {
      piVar2 = __errno_location();
      local_14 = *piVar2;
    }
    else {
      if (in_RSI != (undefined4 *)0x0) {
        *in_RSI = (int)sVar1;
      }
      *(undefined1 *)((long)in_RDI + sVar1 + 8) = 0;
    }
  }
  return local_14;
}

Assistant:

int FileUtil::ReadSmallFile::readToBuffer(int* size)
{
  int err = err_;
  if (fd_ >= 0)
  {
    ssize_t n = ::pread(fd_, buf_, sizeof(buf_)-1, 0);
    if (n >= 0)
    {
      if (size)
      {
        *size = static_cast<int>(n);
      }
      buf_[n] = '\0';
    }
    else
    {
      err = errno;
    }
  }
  return err;
}